

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdatawidgetmapper.cpp
# Opt level: O2

void __thiscall QDataWidgetMapper::setCurrentModelIndex(QDataWidgetMapper *this,QModelIndex *index)

{
  long lVar1;
  bool bVar2;
  QModelIndex *pQVar3;
  long in_FS_OFFSET;
  QModelIndex local_40;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  lVar1 = *(long *)(this + 8);
  bVar2 = QModelIndex::isValid(index);
  if ((bVar2) && ((index->m).ptr == *(QAbstractItemModel **)(lVar1 + 0x78))) {
    QModelIndex::parent(&local_40,index);
    bVar2 = ::operator!=(&local_40,(QPersistentModelIndex *)(lVar1 + 0x90));
    if (!bVar2) {
      pQVar3 = (QModelIndex *)&index->c;
      if (*(int *)(lVar1 + 0x88) == 1) {
        pQVar3 = index;
      }
      (**(code **)(*(long *)this + 0x60))(this,pQVar3->r);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QDataWidgetMapper::setCurrentModelIndex(const QModelIndex &index)
{
    Q_D(QDataWidgetMapper);

    if (!index.isValid()
        || index.model() != d->model
        || index.parent() != d->rootIndex)
        return;

    setCurrentIndex(d->orientation == Qt::Horizontal ? index.row() : index.column());
}